

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfp_helper.c
# Opt level: O0

void helper_dsub(CPUPPCState_conflict *env,ppc_fprp_t *t,ppc_fprp_t *a,ppc_fprp_t *b)

{
  undefined1 local_f8 [8];
  PPC_DFP dfp;
  ppc_fprp_t *b_local;
  ppc_fprp_t *a_local;
  ppc_fprp_t *t_local;
  CPUPPCState_conflict *env_local;
  
  dfp._200_8_ = b;
  dfp_prepare_decimal64((PPC_DFP *)local_f8,a,b,env);
  decNumberSubtract((decNumber_conflict *)((long)&dfp.vb + 8),(decNumber_conflict *)(dfp.t.lsu + 9),
                    (decNumber_conflict *)(dfp.a.lsu + 9),(decContext *)(dfp.b.lsu + 9));
  dfp_finalize_decimal64((PPC_DFP *)local_f8);
  SUB_PPs((PPC_DFP *)local_f8);
  set_dfp64(t,(ppc_vsr_t *)&dfp.field_0x8);
  return;
}

Assistant:

static void MUL_PPs(struct PPC_DFP *dfp)
{
    dfp_set_FPRF_from_FRT(dfp);
    dfp_check_for_OX(dfp);
    dfp_check_for_UX(dfp);
    dfp_check_for_XX(dfp);
    dfp_check_for_VXSNAN(dfp);
    dfp_check_for_VXIMZ(dfp);
}